

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O0

bool __thiscall
cmForEachFunctionBlocker::IsFunctionBlocked
          (cmForEachFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  cmFunctionBlocker *pcVar4;
  reference pvVar5;
  size_type sVar6;
  reference lff_00;
  uint local_a0;
  cmExecutionStatus local_9c;
  uint c;
  cmExecutionStatus status;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  const_iterator j;
  string local_70 [8];
  string oldDef;
  undefined1 local_48 [24];
  auto_ptr<cmFunctionBlocker> fb;
  cmExecutionStatus *inStatus_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmForEachFunctionBlocker *this_local;
  
  fb.x_ = (cmFunctionBlocker *)inStatus;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"foreach");
  if (iVar2 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"endforeach");
    if (iVar2 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_48,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        local_48._8_8_ = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_48);
        ::cm::auto_ptr<cmFunctionBlocker>::auto_ptr
                  ((auto_ptr<cmFunctionBlocker> *)(local_48 + 0x10),
                   (auto_ptr_ref<cmFunctionBlocker>)local_48._8_8_);
        ::cm::auto_ptr<cmFunctionBlocker>::~auto_ptr((auto_ptr<cmFunctionBlocker> *)local_48);
        pcVar4 = ::cm::auto_ptr<cmFunctionBlocker>::get
                           ((auto_ptr<cmFunctionBlocker> *)(local_48 + 0x10));
        if (pcVar4 == (cmFunctionBlocker *)0x0) {
          this_local._7_1_ = false;
          oldDef.field_2._12_4_ = 1;
        }
        else {
          std::__cxx11::string::string(local_70);
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->Args,0);
          pcVar3 = cmMakefile::GetDefinition(mf,pvVar5);
          if (pcVar3 != (char *)0x0) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&this->Args,0);
            pcVar3 = cmMakefile::GetDefinition(mf,pvVar5);
            std::__cxx11::string::operator=(local_70,pcVar3);
          }
          local_90._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->Args);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_88,&local_90);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_88);
          while( true ) {
            _c = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->Args);
            bVar1 = __gnu_cxx::operator!=
                              (&local_88,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&c);
            if (!bVar1) break;
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&this->Args,0);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->(&local_88);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition(mf,pvVar5,pcVar3);
            cmExecutionStatus::cmExecutionStatus(&local_9c);
            for (local_a0 = 0;
                sVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                                  (&this->Functions), local_a0 < sVar6; local_a0 = local_a0 + 1) {
              cmExecutionStatus::Clear(&local_9c);
              lff_00 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                       operator[](&this->Functions,(ulong)local_a0);
              cmMakefile::ExecuteCommand(mf,lff_00,&local_9c);
              bVar1 = cmExecutionStatus::GetReturnInvoked(&local_9c);
              if (bVar1) {
                cmExecutionStatus::SetReturnInvoked((cmExecutionStatus *)fb.x_);
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&this->Args,0);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmMakefile::AddDefinition(mf,pvVar5,pcVar3);
                goto LAB_0061cf61;
              }
              bVar1 = cmExecutionStatus::GetBreakInvoked(&local_9c);
              if (bVar1) {
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&this->Args,0);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmMakefile::AddDefinition(mf,pvVar5,pcVar3);
                goto LAB_0061cf61;
              }
              bVar1 = cmExecutionStatus::GetContinueInvoked(&local_9c);
              if (bVar1) break;
              bVar1 = cmSystemTools::GetFatalErrorOccured();
              if (bVar1) goto LAB_0061cf61;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_88);
          }
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->Args,0);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddDefinition(mf,pvVar5,pcVar3);
LAB_0061cf61:
          this_local._7_1_ = true;
          oldDef.field_2._12_4_ = 1;
          std::__cxx11::string::~string(local_70);
        }
        ::cm::auto_ptr<cmFunctionBlocker>::~auto_ptr
                  ((auto_ptr<cmFunctionBlocker> *)(local_48 + 0x10));
        return this_local._7_1_;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmForEachFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                                 cmMakefile& mf,
                                                 cmExecutionStatus& inStatus)
{
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "foreach")) {
    // record the number of nested foreach commands
    this->Depth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endforeach")) {
    // if this is the endofreach for this statement
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      CM_AUTO_PTR<cmFunctionBlocker> fb(mf.RemoveFunctionBlocker(this, lff));
      if (!fb.get()) {
        return false;
      }

      // at end of for each execute recorded commands
      // store the old value
      std::string oldDef;
      if (mf.GetDefinition(this->Args[0])) {
        oldDef = mf.GetDefinition(this->Args[0]);
      }
      std::vector<std::string>::const_iterator j = this->Args.begin();
      ++j;

      for (; j != this->Args.end(); ++j) {
        // set the variable to the loop value
        mf.AddDefinition(this->Args[0], j->c_str());
        // Invoke all the functions that were collected in the block.
        cmExecutionStatus status;
        for (unsigned int c = 0; c < this->Functions.size(); ++c) {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c], status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetBreakInvoked()) {
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
      }

      // restore the variable to its prior value
      mf.AddDefinition(this->Args[0], oldDef.c_str());
      return true;
    }
    // close out a nested foreach
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}